

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O1

cell * references::scheme::proc_div(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  pointer pcVar2;
  scheme *this;
  long lVar3;
  long extraout_RDX;
  long n;
  string local_40;
  
  pcVar1 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  this = (scheme *)atol((pcVar1->val)._M_dataplus._M_p);
  pcVar2 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  n = extraout_RDX;
  while (pcVar1 + 1 != pcVar2) {
    lVar3 = atol(pcVar1[1].val._M_dataplus._M_p);
    n = (long)this % lVar3;
    this = (scheme *)((long)this / lVar3);
    pcVar1 = pcVar1 + 1;
  }
  str_abi_cxx11_(&local_40,this,n);
  __return_storage_ptr__->type = Number;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->list).
  super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->env = (environment *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cell proc_div(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i) n /= atol(i->val.c_str());
	return cell(Number, str(n));
}